

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O0

Offset wabt::WriteFixedU32Leb128At(Stream *stream,Offset offset,uint32_t value,char *desc)

{
  Offset size;
  Offset length;
  char *pcStack_28;
  uint8_t data [5];
  char *desc_local;
  uint32_t value_local;
  Offset offset_local;
  Stream *stream_local;
  
  pcStack_28 = desc;
  size = WriteFixedU32Leb128Raw
                   ((uint8_t *)((long)&length + 3),(uint8_t *)&stack0xffffffffffffffd8,value);
  Stream::WriteDataAt(stream,offset,(void *)((long)&length + 3),size,pcStack_28,No);
  return size;
}

Assistant:

Offset WriteFixedU32Leb128At(Stream* stream,
                             Offset offset,
                             uint32_t value,
                             const char* desc) {
  uint8_t data[MAX_U32_LEB128_BYTES];
  Offset length =
      WriteFixedU32Leb128Raw(data, data + MAX_U32_LEB128_BYTES, value);
  stream->WriteDataAt(offset, data, length, desc);
  return length;
}